

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor.cpp
# Opt level: O2

void __thiscall Executor::visit(Executor *this,VariableDeclarationNode *node)

{
  int in_ECX;
  void *__child_stack;
  void *in_R8;
  TypeName type;
  shared_ptr<ExpressionNode> value;
  string name;
  undefined1 local_b0 [16];
  shared_ptr<RuntimeSymbol> local_a0;
  undefined1 local_90 [16];
  string local_80;
  Context local_60;
  
  std::__cxx11::string::string((string *)(local_90 + 0x10),(string *)&node->name_);
  local_b0._12_4_ = node->type_;
  std::__shared_ptr<ExpressionNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<ExpressionNode,_(__gnu_cxx::_Lock_policy)2> *)local_90,
             &(node->value_).super___shared_ptr<ExpressionNode,_(__gnu_cxx::_Lock_policy)2>);
  Context::clone((Context *)(local_90 + 0x30),(__fn *)&this->context_,__child_stack,in_ECX,in_R8);
  std::
  make_unique<RuntimeVariableSymbol,std::__cxx11::string_const&,TypeName_const&,std::shared_ptr<ExpressionNode>&,Context>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
             (TypeName *)(local_90 + 0x10),(shared_ptr<ExpressionNode> *)(local_b0 + 0xc),
             (Context *)local_90);
  std::
  deque<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>_>_>
  ::~deque((deque<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>_>_>
            *)(local_90 + 0x30));
  std::__shared_ptr<RuntimeSymbol,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<RuntimeVariableSymbol,std::default_delete<RuntimeVariableSymbol>,void>
            ((__shared_ptr<RuntimeSymbol,(__gnu_cxx::_Lock_policy)2> *)&local_a0,
             (unique_ptr<RuntimeVariableSymbol,_std::default_delete<RuntimeVariableSymbol>_> *)
             local_b0);
  Context::addSymbol(&this->context_,(string *)(local_90 + 0x10),&local_a0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_a0.super___shared_ptr<RuntimeSymbol,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  if ((long *)local_b0._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_b0._0_8_ + 8))();
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_90 + 8));
  std::__cxx11::string::~string((string *)(local_90 + 0x10));
  return;
}

Assistant:

void Executor::visit(const VariableDeclarationNode& node)
{
  const auto name = node.getName();
  const auto type = node.getType();
  auto value = node.getValue();

  auto symbol = std::make_unique<RuntimeVariableSymbol>(name, type, value, context_.clone());
  context_.addSymbol(name, std::move(symbol));
}